

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::describeInterpolation
               (string *stage,VaryingInterpolation qual,ostringstream *name,ostringstream *desc)

{
  Interpolation interpolation;
  ostream *poVar1;
  char *__s;
  allocator<char> local_49;
  string local_48 [8];
  string qualName;
  ostringstream *desc_local;
  ostringstream *name_local;
  VaryingInterpolation qual_local;
  string *stage_local;
  
  qualName.field_2._8_8_ = desc;
  if (qual == VARYINGINTERPOLATION_DEFAULT) {
    poVar1 = std::operator<<((ostream *)desc,", unqualified in ");
    poVar1 = std::operator<<(poVar1,(string *)stage);
    std::operator<<(poVar1," shader");
  }
  else {
    interpolation = getGluInterpolation(qual);
    __s = glu::getInterpolationName(interpolation);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,__s,&local_49);
    std::allocator<char>::~allocator(&local_49);
    poVar1 = std::operator<<((ostream *)name,"_");
    poVar1 = std::operator<<(poVar1,(string *)stage);
    poVar1 = std::operator<<(poVar1,"_");
    std::operator<<(poVar1,local_48);
    poVar1 = std::operator<<((ostream *)qualName.field_2._8_8_,", qualified \'");
    poVar1 = std::operator<<(poVar1,local_48);
    poVar1 = std::operator<<(poVar1,"\' in ");
    poVar1 = std::operator<<(poVar1,(string *)stage);
    std::operator<<(poVar1," shader");
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void describeInterpolation (const string& stage, VaryingInterpolation qual,
							ostringstream& name, ostringstream& desc)
{
	DE_ASSERT(qual < VARYINGINTERPOLATION_RANDOM);

	if (qual == VARYINGINTERPOLATION_DEFAULT)
	{
		desc << ", unqualified in " << stage << " shader";
		return;
	}
	else
	{
		const string qualName = glu::getInterpolationName(getGluInterpolation(qual));

		name << "_" << stage << "_" << qualName;
		desc << ", qualified '" << qualName << "' in " << stage << " shader";
	}
}